

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution1D_x86::forward(Convolution1D_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  void *pvVar9;
  void *pvVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  size_t sVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  int *piVar23;
  byte bVar24;
  ulong uVar25;
  long lVar26;
  float *pfVar27;
  ulong uVar28;
  float *pfVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  float *pfVar33;
  ulong uVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  long lVar38;
  ulong uVar39;
  int iVar40;
  int iVar41;
  ulong uVar42;
  long lVar43;
  long lVar44;
  undefined4 *puVar45;
  int iVar46;
  ulong uVar47;
  float *pfVar48;
  int iVar49;
  long lVar50;
  long lVar51;
  float *pfVar52;
  undefined4 *puVar53;
  ulong uVar54;
  long lVar55;
  long lVar56;
  int iVar57;
  ulong uVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  uint uVar62;
  uint uVar65;
  v4sf one;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar63 [16];
  undefined1 extraout_var [12];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined8 uVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  long local_1c0;
  int local_1b8;
  undefined1 (*local_1a0) [16];
  int local_170;
  int local_138;
  Mat local_b8;
  ulong local_70;
  undefined1 local_68 [16];
  ulong local_58;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  uVar25 = bottom_blob->elemsize;
  iVar6 = bottom_blob->elempack;
  iVar35 = (this->super_Convolution1D).kernel_w;
  iVar7 = (this->super_Convolution1D).dilation_w;
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.allocator = (Allocator *)0x0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  Convolution1D::make_padding(&this->super_Convolution1D,bottom_blob,&local_b8,opt);
  iVar57 = -100;
  if ((local_b8.data != (void *)0x0) && ((long)local_b8.c * local_b8.cstep != 0)) {
    uVar8 = (this->super_Convolution1D).num_output;
    bVar24 = (uVar8 & 3) == 0 & opt->use_packing_layout;
    iVar46 = (uint)bVar24 + (uint)bVar24 * 2 + 1;
    Mat::create(top_blob,(~((iVar35 + -1) * iVar7) + local_b8.w) /
                         (this->super_Convolution1D).stride_w + 1,(int)uVar8 / iVar46,
                uVar25 / (ulong)(long)iVar6 << bVar24 * '\x02',iVar46,opt->blob_allocator);
    iVar6 = local_b8.elempack;
    auVar76 = _DAT_00539570;
    auVar77 = _DAT_00539560;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar35 = (this->super_Convolution1D).dilation_w;
      lVar59 = (long)iVar35;
      iVar7 = (this->super_Convolution1D).stride_w;
      uVar8 = (this->super_Convolution1D).kernel_w;
      iVar57 = (this->super_Convolution1D).activation_type;
      lVar38 = (long)local_b8.elempack;
      lVar55 = (long)local_b8.h;
      iVar46 = local_b8.w * local_b8.elempack;
      local_50 = (ulong)top_blob->w;
      local_70 = (long)top_blob->h * (long)top_blob->elempack;
      lVar50 = (long)top_blob->elempack * local_50;
      pvVar9 = (this->super_Convolution1D).bias_data.data;
      uVar25 = (long)((ulong)(uint)((int)local_70 >> 0x1f) << 0x20 | local_70 & 0xffffffff) / 4;
      iVar35 = iVar35 * 4;
      lVar61 = (long)iVar46;
      iVar22 = iVar46 * 2;
      iVar46 = iVar46 * 3;
      iVar30 = (int)lVar50;
      lVar31 = (long)(iVar30 * 2);
      local_68._0_8_ = lVar31;
      uVar47 = 0;
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      uVar58 = (ulong)uVar8;
      iVar41 = (int)uVar25;
      uVar32 = 0;
      if (0 < iVar41) {
        uVar32 = uVar25 & 0xffffffff;
      }
      lVar60 = lVar59 * 4;
      lVar1 = (long)iVar7 * 4;
      for (; uVar47 != uVar32; uVar47 = uVar47 + 1) {
        uVar37 = top_blob->w;
        iVar40 = top_blob->elempack;
        local_1a0 = (undefined1 (*) [16])
                    ((long)(int)((long)((ulong)(uint)((int)(uVar47 * 4) >> 0x1f) << 0x20 |
                                       uVar47 * 4 & 0xffffffff) / (long)iVar40) * (long)(int)uVar37
                     * top_blob->elemsize + (long)top_blob->data);
        lVar51 = (long)local_b8.h * (long)local_b8.elempack;
        lVar43 = 0;
        uVar25 = 0;
        if (0 < (int)uVar37) {
          uVar25 = (ulong)uVar37;
        }
        iVar49 = 0;
        local_1c0 = lVar61 * 4;
        for (uVar28 = 0; uVar28 != uVar25; uVar28 = uVar28 + 1) {
          fVar79 = 0.0;
          fVar87 = 0.0;
          fVar88 = 0.0;
          fVar89 = 0.0;
          fVar96 = 0.0;
          fVar97 = 0.0;
          fVar98 = 0.0;
          fVar99 = 0.0;
          if (pvVar9 != (void *)0x0) {
            pfVar33 = (float *)((long)pvVar9 + uVar47 * 0x10);
            fVar96 = *pfVar33;
            fVar97 = pfVar33[1];
            fVar98 = pfVar33[2];
            fVar99 = pfVar33[3];
          }
          pfVar52 = (float *)((this->weight_data_tm).cstep * uVar47 *
                              (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          local_1b8 = (int)uVar28;
          lVar44 = (long)local_b8.w *
                   CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
          lVar56 = (long)local_b8.data + local_1c0;
          pfVar33 = (float *)((long)local_b8.data + lVar43);
          uVar42 = 0;
          fVar90 = 0.0;
          fVar91 = 0.0;
          fVar92 = 0.0;
          fVar94 = 0.0;
          fVar100 = 0.0;
          fVar103 = 0.0;
          fVar104 = 0.0;
          fVar105 = 0.0;
          while( true ) {
            local_138 = (int)lVar51;
            if (local_138 <= (int)((uint)uVar42 | 3)) break;
            lVar26 = (int)((long)((ulong)(uint)((int)(uint)uVar42 >> 0x1f) << 0x20 |
                                 uVar42 & 0xffffffff) / (long)local_b8.elempack) * lVar44;
            if (local_b8.elempack == 4) {
              pfVar27 = (float *)((long)local_b8.data + lVar26 + (long)iVar49 * 4);
              uVar54 = uVar58;
              pfVar29 = pfVar52;
              while (iVar36 = (int)uVar54, uVar54 = (ulong)(iVar36 - 1), iVar36 != 0) {
                fVar93 = *pfVar27;
                fVar95 = pfVar27[1];
                fVar2 = pfVar27[2];
                fVar3 = pfVar27[3];
                fVar96 = fVar96 + fVar93 * *pfVar29;
                fVar97 = fVar97 + fVar93 * pfVar29[1];
                fVar98 = fVar98 + fVar93 * pfVar29[2];
                fVar99 = fVar99 + fVar93 * pfVar29[3];
                fVar100 = fVar100 + fVar95 * pfVar29[4];
                fVar103 = fVar103 + fVar95 * pfVar29[5];
                fVar104 = fVar104 + fVar95 * pfVar29[6];
                fVar105 = fVar105 + fVar95 * pfVar29[7];
                fVar90 = fVar90 + fVar2 * pfVar29[8];
                fVar91 = fVar91 + fVar2 * pfVar29[9];
                fVar92 = fVar92 + fVar2 * pfVar29[10];
                fVar94 = fVar94 + fVar2 * pfVar29[0xb];
                fVar79 = fVar79 + fVar3 * pfVar29[0xc];
                fVar87 = fVar87 + fVar3 * pfVar29[0xd];
                fVar88 = fVar88 + fVar3 * pfVar29[0xe];
                fVar89 = fVar89 + fVar3 * pfVar29[0xf];
                pfVar29 = pfVar29 + 0x10;
                pfVar27 = pfVar27 + iVar35;
              }
              pfVar52 = pfVar52 + uVar58 * 0x10;
            }
            else {
              pfVar27 = (float *)((long)local_b8.data +
                                 lVar26 + (long)(local_b8.elempack * iVar7 * local_1b8) * 4);
            }
            uVar54 = uVar58;
            pfVar29 = pfVar52;
            if (local_b8.elempack == 1) {
              while ((int)uVar54 != 0) {
                fVar93 = *pfVar27;
                fVar96 = fVar96 + fVar93 * *pfVar29;
                fVar97 = fVar97 + fVar93 * pfVar29[1];
                fVar98 = fVar98 + fVar93 * pfVar29[2];
                fVar99 = fVar99 + fVar93 * pfVar29[3];
                fVar93 = pfVar27[lVar61];
                fVar100 = fVar100 + fVar93 * pfVar29[4];
                fVar103 = fVar103 + fVar93 * pfVar29[5];
                fVar104 = fVar104 + fVar93 * pfVar29[6];
                fVar105 = fVar105 + fVar93 * pfVar29[7];
                fVar93 = pfVar27[iVar22];
                fVar95 = pfVar27[iVar46];
                fVar90 = fVar90 + fVar93 * pfVar29[8];
                fVar91 = fVar91 + fVar93 * pfVar29[9];
                fVar92 = fVar92 + fVar93 * pfVar29[10];
                fVar94 = fVar94 + fVar93 * pfVar29[0xb];
                fVar79 = fVar79 + fVar95 * pfVar29[0xc];
                fVar87 = fVar87 + fVar95 * pfVar29[0xd];
                fVar88 = fVar88 + fVar95 * pfVar29[0xe];
                fVar89 = fVar89 + fVar95 * pfVar29[0xf];
                pfVar27 = pfVar27 + lVar59;
                uVar54 = (ulong)((int)uVar54 - 1);
                pfVar29 = pfVar29 + 0x10;
              }
              pfVar52 = pfVar52 + uVar58 * 0x10;
            }
            uVar42 = uVar42 + 4;
            lVar56 = lVar56 + lVar44 * 4;
            pfVar33 = pfVar33 + lVar44;
          }
          for (; (long)(uVar42 | 1) < lVar51; uVar42 = uVar42 + 2) {
            lVar26 = 0;
            uVar54 = uVar58;
            pfVar27 = pfVar52;
            while (iVar36 = (int)uVar54, uVar54 = (ulong)(iVar36 - 1), iVar36 != 0) {
              fVar93 = *(float *)((long)pfVar33 + lVar26);
              fVar95 = *(float *)(lVar56 + lVar26);
              fVar96 = fVar96 + fVar93 * *pfVar27;
              fVar97 = fVar97 + fVar93 * pfVar27[1];
              fVar98 = fVar98 + fVar93 * pfVar27[2];
              fVar99 = fVar99 + fVar93 * pfVar27[3];
              fVar100 = fVar100 + fVar95 * pfVar27[4];
              fVar103 = fVar103 + fVar95 * pfVar27[5];
              fVar104 = fVar104 + fVar95 * pfVar27[6];
              fVar105 = fVar105 + fVar95 * pfVar27[7];
              pfVar27 = pfVar27 + 8;
              lVar26 = lVar26 + lVar60;
            }
            pfVar52 = pfVar52 + uVar58 * 8;
            lVar56 = lVar56 + lVar44 * 2;
            pfVar33 = (float *)((long)pfVar33 + lVar44 * 2);
          }
          for (; uVar54 = uVar58, pfVar27 = pfVar33, pfVar29 = pfVar52, (long)uVar42 < lVar51;
              uVar42 = uVar42 + 1) {
            while ((int)uVar54 != 0) {
              fVar93 = *pfVar27;
              fVar96 = fVar96 + fVar93 * *pfVar29;
              fVar97 = fVar97 + fVar93 * pfVar29[1];
              fVar98 = fVar98 + fVar93 * pfVar29[2];
              fVar99 = fVar99 + fVar93 * pfVar29[3];
              uVar54 = (ulong)((int)uVar54 - 1);
              pfVar27 = pfVar27 + lVar59;
              pfVar29 = pfVar29 + 4;
            }
            pfVar52 = pfVar52 + uVar58 * 4;
            pfVar33 = (float *)((long)pfVar33 + lVar44);
          }
          fVar96 = fVar100 + fVar96 + fVar90 + fVar79;
          fVar97 = fVar103 + fVar97 + fVar91 + fVar87;
          auVar102._0_8_ = CONCAT44(fVar97,fVar96);
          auVar102._8_4_ = fVar104 + fVar98 + fVar92 + fVar88;
          auVar102._12_4_ = fVar105 + fVar99 + fVar94 + fVar89;
          if (5 < iVar57 - 1U) {
            auVar84._8_4_ = auVar102._8_4_;
            auVar84._0_8_ = auVar102._0_8_;
            auVar84._12_4_ = auVar102._12_4_;
            goto LAB_004c78c1;
          }
          auVar80._8_4_ = auVar102._8_4_;
          auVar80._0_8_ = auVar102._0_8_;
          auVar80._12_4_ = auVar102._12_4_;
          auVar80 = maxps(auVar80,ZEXT816(0));
          fVar98 = auVar77._0_4_;
          fVar99 = auVar77._4_4_;
          fVar79 = auVar77._8_4_;
          fVar87 = auVar77._12_4_;
          fVar88 = auVar76._0_4_;
          fVar89 = auVar76._4_4_;
          fVar90 = auVar76._8_4_;
          fVar91 = auVar76._12_4_;
          auVar84 = auVar80;
          switch(iVar57) {
          case 2:
            auVar102 = minps(auVar102,ZEXT816(0));
            fVar96 = *(this->super_Convolution1D).activation_params.data;
            auVar84._0_4_ = auVar80._0_4_ + fVar96 * auVar102._0_4_;
            auVar84._4_4_ = auVar80._4_4_ + fVar96 * auVar102._4_4_;
            auVar84._8_4_ = auVar80._8_4_ + fVar96 * auVar102._8_4_;
            auVar84._12_4_ = auVar80._12_4_ + fVar96 * auVar102._12_4_;
            break;
          case 3:
            puVar53 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
            uVar4 = *puVar53;
            uVar5 = puVar53[1];
            auVar68._4_4_ = uVar4;
            auVar68._0_4_ = uVar4;
            auVar68._8_4_ = uVar4;
            auVar68._12_4_ = uVar4;
            auVar102 = maxps(auVar102,auVar68);
            auVar18._4_4_ = uVar5;
            auVar18._0_4_ = uVar5;
            auVar18._8_4_ = uVar5;
            auVar18._12_4_ = uVar5;
            auVar84 = minps(auVar102,auVar18);
            break;
          case 4:
            auVar101._0_8_ = CONCAT44(fVar97,fVar96) ^ 0x8000000080000000;
            auVar101._8_4_ = -auVar102._8_4_;
            auVar101._12_4_ = -auVar102._12_4_;
            auVar102 = minps(auVar101,_DAT_00539530);
            auVar102 = maxps(auVar102,_DAT_00539540);
            fVar97 = auVar102._0_4_ * 1.442695 + fVar98;
            fVar94 = auVar102._4_4_ * 1.442695 + fVar99;
            fVar103 = auVar102._8_4_ * 1.442695 + fVar79;
            fVar105 = auVar102._12_4_ * 1.442695 + fVar87;
            fVar96 = (float)(int)fVar97;
            fVar92 = (float)(int)fVar94;
            fVar100 = (float)(int)fVar103;
            fVar104 = (float)(int)fVar105;
            fVar96 = fVar96 - (float)(-(uint)(fVar97 < fVar96) & (uint)fVar88);
            fVar92 = fVar92 - (float)(-(uint)(fVar94 < fVar92) & (uint)fVar89);
            fVar100 = fVar100 - (float)(-(uint)(fVar103 < fVar100) & (uint)fVar90);
            fVar104 = fVar104 - (float)(-(uint)(fVar105 < fVar104) & (uint)fVar91);
            fVar97 = fVar96 * -0.6931472 + auVar102._0_4_;
            fVar94 = fVar92 * -0.6931472 + auVar102._4_4_;
            fVar103 = fVar100 * -0.6931472 + auVar102._8_4_;
            fVar105 = fVar104 * -0.6931472 + auVar102._12_4_;
            auVar17._4_4_ =
                 (float)((int)fVar92 * 0x800000 + (int)fVar89) *
                 (fVar94 + fVar89 +
                 (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94 +
                   0.041665796) * fVar94 + 0.16666666) * fVar94 + fVar99) * fVar94 * fVar94) +
                 fVar89;
            auVar17._0_4_ =
                 (float)((int)fVar96 * 0x800000 + (int)fVar88) *
                 (fVar97 + fVar88 +
                 (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97 +
                   0.041665796) * fVar97 + 0.16666666) * fVar97 + fVar98) * fVar97 * fVar97) +
                 fVar88;
            auVar17._8_4_ =
                 (float)((int)fVar100 * 0x800000 + (int)fVar90) *
                 (fVar103 + fVar90 +
                 (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                   0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar79) * fVar103 * fVar103) +
                 fVar90;
            auVar17._12_4_ =
                 (float)((int)fVar104 * 0x800000 + (int)fVar91) *
                 (fVar105 + fVar91 +
                 (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105 +
                   0.041665796) * fVar105 + 0.16666666) * fVar105 + fVar87) * fVar105 * fVar105) +
                 fVar91;
            auVar84 = divps(auVar76,auVar17);
            break;
          case 5:
            auVar66._8_4_ = auVar102._8_4_;
            auVar66._0_8_ = auVar102._0_8_;
            auVar66._12_4_ = auVar102._12_4_;
            auVar84 = minps(auVar66,_DAT_00539530);
            auVar84 = maxps(auVar84,_DAT_00539540);
            fVar92 = auVar84._0_4_ * 1.442695 + fVar98;
            fVar94 = auVar84._4_4_ * 1.442695 + fVar99;
            fVar100 = auVar84._8_4_ * 1.442695 + fVar79;
            fVar103 = auVar84._12_4_ * 1.442695 + fVar87;
            fVar104 = (float)(int)fVar92;
            fVar105 = (float)(int)fVar94;
            fVar93 = (float)(int)fVar100;
            fVar95 = (float)(int)fVar103;
            fVar104 = fVar104 - (float)(-(uint)(fVar92 < fVar104) & (uint)fVar88);
            fVar105 = fVar105 - (float)(-(uint)(fVar94 < fVar105) & (uint)fVar89);
            fVar93 = fVar93 - (float)(-(uint)(fVar100 < fVar93) & (uint)fVar90);
            fVar95 = fVar95 - (float)(-(uint)(fVar103 < fVar95) & (uint)fVar91);
            fVar92 = auVar84._0_4_ - fVar104 * 0.6931472;
            fVar94 = auVar84._4_4_ - fVar105 * 0.6931472;
            fVar100 = auVar84._8_4_ - fVar93 * 0.6931472;
            fVar103 = auVar84._12_4_ - fVar95 * 0.6931472;
            auVar81._0_4_ =
                 (float)((int)fVar104 * 0x800000 + (int)fVar88) *
                 (fVar92 + fVar88 +
                 (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                   0.041665796) * fVar92 + 0.16666666) * fVar92 + fVar98) * fVar92 * fVar92) +
                 fVar88;
            auVar81._4_4_ =
                 (float)((int)fVar105 * 0x800000 + (int)fVar89) *
                 (fVar94 + fVar89 +
                 (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94 +
                   0.041665796) * fVar94 + 0.16666666) * fVar94 + fVar99) * fVar94 * fVar94) +
                 fVar89;
            auVar81._8_4_ =
                 (float)((int)fVar93 * 0x800000 + (int)fVar90) *
                 (fVar100 + fVar90 +
                 (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) * fVar100 +
                   0.041665796) * fVar100 + 0.16666666) * fVar100 + fVar79) * fVar100 * fVar100) +
                 fVar90;
            auVar81._12_4_ =
                 (float)((int)fVar95 * 0x800000 + (int)fVar91) *
                 (fVar103 + fVar91 +
                 (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                   0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar87) * fVar103 * fVar103) +
                 fVar91;
            auVar84 = maxps(auVar81,_DAT_005395e0);
            auVar82._0_8_ = auVar84._0_8_ & 0x807fffff807fffff;
            auVar82._8_4_ = auVar84._8_4_ & 0x807fffff;
            auVar82._12_4_ = auVar84._12_4_ & 0x807fffff;
            auVar82 = auVar82 | auVar77;
            fVar92 = auVar82._0_4_;
            fVar100 = auVar82._4_4_;
            fVar104 = auVar82._8_4_;
            fVar93 = auVar82._12_4_;
            fVar94 = fVar92 + (float)DAT_00539620 +
                     (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar92);
            fVar103 = fVar100 + DAT_00539620._4_4_ +
                      (float)(-(uint)(fVar100 < 0.70710677) & (uint)fVar100);
            fVar105 = fVar104 + DAT_00539620._8_4_ +
                      (float)(-(uint)(fVar104 < 0.70710677) & (uint)fVar104);
            fVar95 = fVar93 + DAT_00539620._12_4_ +
                     (float)(-(uint)(fVar93 < 0.70710677) & (uint)fVar93);
            auVar67._0_8_ =
                 CONCAT44(-(uint)(auVar81._4_4_ <= 0.0),-(uint)(auVar81._0_4_ <= 0.0)) &
                 0x7fffffff7fffffff;
            auVar67._8_4_ = -(uint)(auVar81._8_4_ <= 0.0) & 0x7fffffff;
            auVar67._12_4_ = -(uint)(auVar81._12_4_ <= 0.0) & 0x7fffffff;
            auVar15._4_4_ =
                 ~-(uint)(auVar81._4_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar84._4_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar100 < 0.70710677) & (uint)fVar89)) * 0.6931472 +
                         fVar103 +
                        (((((((((fVar103 * 0.070376836 + -0.1151461) * fVar103 + 0.116769984) *
                               fVar103 + -0.12420141) * fVar103 + 0.14249323) * fVar103 +
                            -0.16668057) * fVar103 + 0.20000714) * fVar103 + -0.24999994) * fVar103
                         + 0.3333333) * fVar103 + -0.5) * fVar103 * fVar103) * -2.0);
            auVar15._0_4_ =
                 ~-(uint)(auVar81._0_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar84._0_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar88)) * 0.6931472 + fVar94
                        + (((((((((fVar94 * 0.070376836 + -0.1151461) * fVar94 + 0.116769984) *
                                 fVar94 + -0.12420141) * fVar94 + 0.14249323) * fVar94 + -0.16668057
                              ) * fVar94 + 0.20000714) * fVar94 + -0.24999994) * fVar94 + 0.3333333)
                           * fVar94 + -0.5) * fVar94 * fVar94) * -2.0);
            auVar15._8_4_ =
                 ~-(uint)(auVar81._8_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar84._8_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar104 < 0.70710677) & (uint)fVar90)) * 0.6931472 +
                         fVar105 +
                        (((((((((fVar105 * 0.070376836 + -0.1151461) * fVar105 + 0.116769984) *
                               fVar105 + -0.12420141) * fVar105 + 0.14249323) * fVar105 +
                            -0.16668057) * fVar105 + 0.20000714) * fVar105 + -0.24999994) * fVar105
                         + 0.3333333) * fVar105 + -0.5) * fVar105 * fVar105) * -2.0);
            auVar15._12_4_ =
                 ~-(uint)(auVar81._12_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar84._12_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar93 < 0.70710677) & (uint)fVar91)) * 0.6931472 + fVar95
                        + (((((((((fVar95 * 0.070376836 + -0.1151461) * fVar95 + 0.116769984) *
                                 fVar95 + -0.12420141) * fVar95 + 0.14249323) * fVar95 + -0.16668057
                              ) * fVar95 + 0.20000714) * fVar95 + -0.24999994) * fVar95 + 0.3333333)
                           * fVar95 + -0.5) * fVar95 * fVar95) * -2.0);
            auVar84 = minps(auVar67 | auVar15,_DAT_00539530);
            auVar84 = maxps(auVar84,_DAT_00539540);
            fVar92 = auVar84._0_4_ * 1.442695 + fVar98;
            fVar94 = auVar84._4_4_ * 1.442695 + fVar99;
            fVar100 = auVar84._8_4_ * 1.442695 + fVar79;
            fVar103 = auVar84._12_4_ * 1.442695 + fVar87;
            fVar104 = (float)(int)fVar92;
            fVar105 = (float)(int)fVar94;
            fVar93 = (float)(int)fVar100;
            fVar95 = (float)(int)fVar103;
            fVar104 = fVar104 - (float)(-(uint)(fVar92 < fVar104) & (uint)fVar88);
            fVar105 = fVar105 - (float)(-(uint)(fVar94 < fVar105) & (uint)fVar89);
            fVar93 = fVar93 - (float)(-(uint)(fVar100 < fVar93) & (uint)fVar90);
            fVar95 = fVar95 - (float)(-(uint)(fVar103 < fVar95) & (uint)fVar91);
            fVar92 = auVar84._0_4_ - fVar104 * 0.6931472;
            fVar94 = auVar84._4_4_ - fVar105 * 0.6931472;
            fVar100 = auVar84._8_4_ - fVar93 * 0.6931472;
            fVar103 = auVar84._12_4_ - fVar95 * 0.6931472;
            auVar16._4_4_ =
                 (float)((int)fVar105 * 0x800000 + (int)fVar89) *
                 (fVar94 + fVar89 +
                 (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94 +
                   0.041665796) * fVar94 + 0.16666666) * fVar94 + fVar99) * fVar94 * fVar94) +
                 fVar89;
            auVar16._0_4_ =
                 (float)((int)fVar104 * 0x800000 + (int)fVar88) *
                 (fVar92 + fVar88 +
                 (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                   0.041665796) * fVar92 + 0.16666666) * fVar92 + fVar98) * fVar92 * fVar92) +
                 fVar88;
            auVar16._8_4_ =
                 (float)((int)fVar93 * 0x800000 + (int)fVar90) *
                 (fVar100 + fVar90 +
                 (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) * fVar100 +
                   0.041665796) * fVar100 + 0.16666666) * fVar100 + fVar79) * fVar100 * fVar100) +
                 fVar90;
            auVar16._12_4_ =
                 (float)((int)fVar95 * 0x800000 + (int)fVar91) *
                 (fVar103 + fVar91 +
                 (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                   0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar87) * fVar103 * fVar103) +
                 fVar91;
            auVar84 = divps(_DAT_00539ff0,auVar16);
            auVar85._0_4_ = auVar84._0_4_ + (float)DAT_00539620;
            auVar85._4_4_ = auVar84._4_4_ + DAT_00539620._4_4_;
            auVar85._8_4_ = auVar84._8_4_ + DAT_00539620._8_4_;
            auVar85._12_4_ = auVar84._12_4_ + DAT_00539620._12_4_;
            goto LAB_004c78b9;
          case 6:
            pfVar33 = (float *)(this->super_Convolution1D).activation_params.data;
            fVar98 = *pfVar33;
            fVar99 = pfVar33[1];
            auVar83._0_4_ = fVar98 * fVar96 + fVar99;
            auVar83._4_4_ = fVar98 * fVar97 + fVar99;
            auVar83._8_4_ = fVar98 * auVar102._8_4_ + fVar99;
            auVar83._12_4_ = fVar98 * auVar102._12_4_ + fVar99;
            auVar84 = maxps(auVar83,ZEXT816(0));
            auVar85 = minps(auVar84,auVar76);
LAB_004c78b9:
            auVar84._0_4_ = auVar85._0_4_ * fVar96;
            auVar84._4_4_ = auVar85._4_4_ * fVar97;
            auVar84._8_4_ = auVar85._8_4_ * auVar102._8_4_;
            auVar84._12_4_ = auVar85._12_4_ * auVar102._12_4_;
          }
LAB_004c78c1:
          if (iVar40 == 1) {
            *(int *)*local_1a0 = auVar84._0_4_;
            *(int *)((long)*local_1a0 + lVar50 * 4) = auVar84._4_4_;
            *(int *)((long)*local_1a0 + lVar31 * 4) = auVar84._8_4_;
            *(int *)((long)*local_1a0 + (long)(iVar30 * 3) * 4) = auVar84._12_4_;
            local_1a0 = (undefined1 (*) [16])((long)*local_1a0 + 4);
          }
          else if (iVar40 == 4) {
            *local_1a0 = auVar84;
            local_1a0 = local_1a0 + 1;
          }
          iVar49 = iVar49 + local_b8.elempack * iVar7;
          local_1c0 = local_1c0 + lVar1;
          lVar43 = lVar43 + lVar1;
        }
      }
      uVar25 = (long)((int)local_70 + iVar41 * -4) / 2;
      local_58 = uVar25 & 0xffffffff;
      lVar31 = (long)local_b8.h * (long)local_b8.elempack;
      uVar37 = top_blob->w;
      pvVar10 = top_blob->data;
      local_38 = (long)(int)uVar37 * top_blob->elemsize;
      iVar30 = local_b8.elempack * iVar7;
      uVar47 = 0;
      if (0 < (int)uVar37) {
        uVar47 = (ulong)uVar37;
      }
      uVar32 = 0;
      if (0 < (int)uVar25) {
        uVar32 = uVar25 & 0xffffffff;
      }
      local_40 = (long)(iVar41 * 4);
      local_48 = lVar61 * 4;
      for (uVar25 = 0; uVar25 != uVar32; uVar25 = uVar25 + 1) {
        uVar28 = local_40 + uVar25 * 2;
        uVar42 = (ulong)(uint)((int)uVar28 >> 0x1f) << 0x20 | uVar28 & 0xffffffff;
        puVar53 = (undefined4 *)(uVar28 * local_38 + (long)pvVar10);
        sVar11 = (this->weight_data_tm).cstep;
        sVar12 = (this->weight_data_tm).elemsize;
        puVar45 = (undefined4 *)((local_40 + uVar25 * 2 + 1) * local_38 + (long)pvVar10);
        pvVar13 = (this->weight_data_tm).data;
        pfVar33 = (float *)(this->super_Convolution1D).activation_params.data;
        lVar43 = 0;
        iVar40 = 0;
        lVar50 = local_48;
        for (uVar54 = 0; uVar54 != uVar47; uVar54 = uVar54 + 1) {
          fVar96 = 0.0;
          fVar97 = 0.0;
          fVar98 = 0.0;
          fVar99 = 0.0;
          uVar75 = 0;
          if (pvVar9 != (void *)0x0) {
            uVar75 = *(undefined8 *)((long)pvVar9 + uVar28 * 4);
          }
          lVar56 = (long)local_b8.w *
                   CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
          lVar51 = (long)local_b8.data + lVar50;
          pfVar27 = (float *)((long)local_b8.data + lVar43);
          uVar34 = 0;
          fVar79 = 0.0;
          fVar87 = 0.0;
          fVar88 = 0.0;
          fVar89 = 0.0;
          pfVar52 = (float *)((long)(((int)((long)uVar42 % 4) >> 1) + (int)((long)uVar42 / 4)) *
                              sVar11 * sVar12 + (long)pvVar13);
          while( true ) {
            local_138 = (int)lVar31;
            if (local_138 <= (int)((uint)uVar34 | 3)) break;
            lVar44 = (int)((long)((ulong)(uint)((int)(uint)uVar34 >> 0x1f) << 0x20 |
                                 uVar34 & 0xffffffff) / (long)iVar6) * lVar56;
            if (iVar6 == 4) {
              pfVar29 = (float *)((long)local_b8.data + lVar44 + (long)iVar40 * 4);
              uVar39 = uVar58;
              pfVar48 = pfVar52;
              while (iVar49 = (int)uVar39, uVar39 = (ulong)(iVar49 - 1), iVar49 != 0) {
                fVar96 = fVar96 + *pfVar48 * *pfVar29;
                fVar97 = fVar97 + pfVar48[1] * pfVar29[1];
                fVar98 = fVar98 + pfVar48[2] * pfVar29[2];
                fVar99 = fVar99 + pfVar48[3] * pfVar29[3];
                fVar79 = fVar79 + *pfVar29 * pfVar48[4];
                fVar87 = fVar87 + pfVar29[1] * pfVar48[5];
                fVar88 = fVar88 + pfVar29[2] * pfVar48[6];
                fVar89 = fVar89 + pfVar29[3] * pfVar48[7];
                pfVar48 = pfVar48 + 8;
                pfVar29 = pfVar29 + iVar35;
              }
              pfVar52 = pfVar52 + uVar58 * 8;
            }
            else {
              pfVar29 = (float *)((long)local_b8.data + lVar44 + (long)(iVar30 * (int)uVar54) * 4);
            }
            uVar39 = uVar58;
            pfVar48 = pfVar52;
            if (iVar6 == 1) {
              while ((int)uVar39 != 0) {
                fVar96 = fVar96 + *pfVar48 * *pfVar29;
                fVar97 = fVar97 + pfVar48[1] * pfVar29[lVar61];
                fVar98 = fVar98 + pfVar48[2] * pfVar29[iVar22];
                fVar99 = fVar99 + pfVar48[3] * pfVar29[iVar46];
                fVar79 = fVar79 + *pfVar29 * pfVar48[4];
                fVar87 = fVar87 + pfVar29[lVar61] * pfVar48[5];
                fVar88 = fVar88 + pfVar29[iVar22] * pfVar48[6];
                fVar89 = fVar89 + pfVar29[iVar46] * pfVar48[7];
                pfVar29 = pfVar29 + lVar59;
                uVar39 = (ulong)((int)uVar39 - 1);
                pfVar48 = pfVar48 + 8;
              }
              pfVar52 = pfVar52 + uVar58 * 8;
            }
            uVar34 = uVar34 + 4;
            lVar51 = lVar51 + lVar56 * 4;
            pfVar27 = pfVar27 + lVar56;
          }
          auVar77._0_4_ = (float)uVar75 + fVar98 + fVar96 + fVar99 + fVar97;
          auVar77._4_4_ = (float)((ulong)uVar75 >> 0x20) + fVar88 + fVar79 + fVar89 + fVar87;
          auVar77._8_4_ = fVar99 + fVar97 + 0.0 + fVar98 + fVar98;
          auVar77._12_4_ = fVar89 + fVar87 + 0.0 + fVar99 + fVar99;
          for (; (long)(uVar34 | 1) < lVar31; uVar34 = uVar34 + 2) {
            lVar44 = 0;
            uVar39 = uVar58;
            pfVar29 = pfVar52;
            while (iVar49 = (int)uVar39, uVar39 = (ulong)(iVar49 - 1), iVar49 != 0) {
              fVar96 = *(float *)((long)pfVar27 + lVar44);
              fVar98 = auVar77._4_4_;
              fVar99 = auVar77._8_4_;
              fVar79 = auVar77._12_4_;
              fVar97 = *(float *)(lVar51 + lVar44);
              auVar77._0_4_ =
                   fVar97 * (float)*(undefined8 *)(pfVar29 + 2) +
                   (float)*(undefined8 *)pfVar29 * fVar96 + auVar77._0_4_;
              auVar77._4_4_ =
                   fVar97 * (float)((ulong)*(undefined8 *)(pfVar29 + 2) >> 0x20) +
                   (float)((ulong)*(undefined8 *)pfVar29 >> 0x20) * fVar96 + fVar98;
              auVar77._8_4_ = fVar97 * 0.0 + fVar96 * 0.0 + fVar99;
              auVar77._12_4_ = fVar97 * 0.0 + fVar96 * 0.0 + fVar79;
              pfVar29 = pfVar29 + 4;
              lVar44 = lVar44 + lVar60;
            }
            pfVar52 = pfVar52 + uVar58 * 4;
            lVar51 = lVar51 + lVar56 * 2;
            pfVar27 = (float *)((long)pfVar27 + lVar56 * 2);
          }
          for (; uVar39 = auVar77._0_8_, (long)uVar34 < lVar31; uVar34 = uVar34 + 1) {
            pfVar29 = pfVar27;
            for (lVar51 = 0; uVar8 != (uint)lVar51; lVar51 = lVar51 + 1) {
              fVar96 = *pfVar29;
              auVar76._0_4_ = auVar77._0_4_ + fVar96 * (float)*(undefined8 *)(pfVar52 + lVar51 * 2);
              auVar76._4_4_ =
                   auVar77._4_4_ +
                   fVar96 * (float)((ulong)*(undefined8 *)(pfVar52 + lVar51 * 2) >> 0x20);
              auVar76._8_4_ = auVar77._8_4_ + fVar96 * 0.0;
              auVar76._12_4_ = auVar77._12_4_ + fVar96 * 0.0;
              pfVar29 = pfVar29 + lVar59;
              auVar77 = auVar76;
            }
            pfVar52 = pfVar52 + uVar58 * 2;
            pfVar27 = (float *)((long)pfVar27 + lVar56);
          }
          if (iVar57 - 1U < 6) {
            fVar96 = auVar77._0_4_;
            fVar97 = auVar77._4_4_;
            auVar86._4_4_ = fVar97;
            auVar86._0_4_ = fVar97;
            auVar86._8_4_ = fVar97;
            auVar86._12_4_ = fVar97;
            switch(iVar57) {
            case 1:
              auVar77 = maxps(auVar77,_DAT_005381d0);
              uVar39 = auVar77._0_8_;
              break;
            case 2:
              fVar98 = *pfVar33;
              auVar63._0_8_ =
                   CONCAT44(-(uint)(0.0 < fVar97),-(uint)(0.0 < fVar96)) & 0x3f8000003f800000;
              auVar63._8_8_ = 0;
              auVar19._4_4_ = ~-(uint)(0.0 < fVar97) & (uint)fVar98;
              auVar19._0_4_ = ~-(uint)(0.0 < fVar96) & (uint)fVar98;
              auVar19._8_4_ = ~-(uint)(0.0 < auVar77._8_4_) & (uint)fVar98;
              auVar19._12_4_ = ~-(uint)(0.0 < auVar77._12_4_) & (uint)fVar98;
              uVar39 = CONCAT44(fVar97 * SUB164(auVar63 | auVar19,4),
                                fVar96 * SUB164(auVar63 | auVar19,0));
              break;
            case 3:
              fVar99 = (float)*(undefined8 *)pfVar33;
              fVar79 = (float)((ulong)*(undefined8 *)pfVar33 >> 0x20);
              fVar98 = fVar99;
              if (fVar99 <= fVar96) {
                fVar98 = fVar96;
              }
              auVar72._0_4_ = ~-(uint)(fVar97 < fVar99) & (uint)fVar97;
              auVar72._4_4_ = ~-(uint)(fVar79 < fVar98) & (uint)fVar98;
              auVar72._8_4_ = ~-(uint)(fVar97 < 0.0) & (uint)fVar97;
              auVar72._12_4_ = ~-(uint)(fVar97 < 0.0) & (uint)fVar97;
              auVar20._4_4_ = (uint)fVar79 & -(uint)(fVar79 < fVar98);
              auVar20._0_4_ = (uint)fVar99 & -(uint)(fVar97 < fVar99);
              auVar20._8_8_ = 0;
              fVar96 = SUB164(auVar72 | auVar20,0);
              if (fVar79 < fVar96) {
                fVar96 = fVar79;
              }
              uVar39 = CONCAT44(fVar96,SUB164(auVar72 | auVar20,4));
              break;
            case 4:
              auVar77 = minps(auVar77,_DAT_0053a010);
              uVar37 = -(uint)(auVar77._0_4_ < -88.37626);
              uVar62 = -(uint)(auVar77._4_4_ < -88.37626);
              uVar65 = DAT_0053a010._4_4_;
              fVar96 = expf((float)(~uVar37 & (uint)-auVar77._0_4_ | (uint)DAT_0053a010 & uVar37));
              fVar97 = expf((float)(~uVar62 & (uint)-auVar77._4_4_ | uVar65 & uVar62));
              auVar69._0_4_ = fVar96 + (float)DAT_0053a030;
              auVar69._4_4_ = fVar97 + DAT_0053a030._4_4_;
              auVar69._8_4_ = extraout_XMM0_Db + DAT_0053a030._8_4_;
              auVar69._12_4_ = extraout_XMM0_Db_00 + DAT_0053a030._12_4_;
              auVar77 = divps(_DAT_0053a030,auVar69);
              uVar39 = auVar77._0_8_;
              break;
            case 5:
              local_68 = auVar86;
              fVar98 = expf(fVar96);
              fVar98 = logf(fVar98 + 1.0);
              fVar98 = tanhf(fVar98);
              fVar99 = expf((float)local_68._0_4_);
              fVar99 = logf(fVar99 + 1.0);
              fVar99 = tanhf(fVar99);
              uVar39 = CONCAT44(fVar97 * fVar99,fVar96 * fVar98);
              break;
            case 6:
              fVar98 = *pfVar33;
              fVar99 = pfVar33[1];
              fVar87 = -fVar99 / fVar98;
              fVar79 = 0.0;
              if ((fVar87 <= fVar96) && (fVar79 = fVar96, fVar96 <= 1.0 / fVar98 + fVar87)) {
                fVar79 = (fVar98 * fVar96 + fVar99) * fVar96;
              }
              if (fVar87 <= fVar97) {
                auVar78._4_12_ = auVar77._4_12_;
                auVar78._0_4_ = fVar79;
                uVar39 = auVar78._0_8_;
                if (fVar97 <= fVar87 + 1.0 / fVar98) {
                  uVar39 = CONCAT44((fVar98 * fVar97 + fVar99) * fVar97,fVar79);
                }
              }
              else {
                uVar39 = (ulong)(uint)fVar79;
              }
            }
          }
          *puVar53 = (int)uVar39;
          *puVar45 = (int)(uVar39 >> 0x20);
          puVar53 = puVar53 + 1;
          puVar45 = puVar45 + 1;
          iVar40 = iVar40 + iVar30;
          lVar50 = lVar50 + lVar1;
          lVar43 = lVar43 + lVar1;
        }
      }
      lVar55 = lVar55 * lVar38;
      iVar30 = top_blob->w;
      sVar11 = top_blob->elemsize;
      pvVar10 = top_blob->data;
      uVar25 = 0;
      if (0 < (int)local_50) {
        uVar25 = local_50 & 0xffffffff;
      }
      for (uVar47 = (ulong)(iVar41 * 4 + (int)local_58 * 2); (long)uVar47 < (long)local_70;
          uVar47 = uVar47 + 1) {
        uVar37 = (int)uVar47 >> 0x1f;
        uVar32 = (ulong)uVar37 << 0x20 | uVar47 & 0xffffffff;
        sVar12 = (this->weight_data_tm).cstep;
        sVar14 = (this->weight_data_tm).elemsize;
        puVar53 = (undefined4 *)((long)iVar30 * sVar11 * uVar47 + (long)pvVar10);
        pvVar13 = (this->weight_data_tm).data;
        pfVar33 = (float *)(this->super_Convolution1D).activation_params.data;
        lVar38 = 0;
        iVar41 = 0;
        lVar31 = lVar61 * 4;
        for (uVar28 = 0; uVar28 != uVar25; uVar28 = uVar28 + 1) {
          if (pvVar9 == (void *)0x0) {
            fVar96 = 0.0;
          }
          else {
            fVar96 = *(float *)((long)pvVar9 + uVar47 * 4);
          }
          lVar43 = (long)local_b8.w *
                   CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
          lVar50 = (long)local_b8.data + lVar31;
          pfVar27 = (float *)((long)local_b8.data + lVar38);
          auVar77 = ZEXT816(0);
          uVar42 = 0;
          pfVar52 = (float *)((long)((int)((long)((ulong)uVar37 << 0x20 | uVar47 & 0xffffffff) % 2)
                                     + (int)((long)uVar32 / 4) +
                                    (int)(char)((char)((long)uVar32 % 4) / '\x02')) * sVar12 *
                              sVar14 + (long)pvVar13);
          while( true ) {
            local_170 = (int)lVar55;
            if (local_170 <= (int)((uint)uVar42 | 3)) break;
            lVar51 = (int)((long)((ulong)(uint)((int)(uint)uVar42 >> 0x1f) << 0x20 |
                                 uVar42 & 0xffffffff) / (long)iVar6) * lVar43;
            if (iVar6 == 4) {
              pfVar29 = (float *)((long)local_b8.data + lVar51 + (long)iVar41 * 4);
              uVar54 = uVar58;
              pfVar48 = pfVar52;
              while (iVar40 = (int)uVar54, uVar54 = (ulong)(iVar40 - 1), iVar40 != 0) {
                auVar70._0_4_ = auVar77._0_4_ + *pfVar48 * *pfVar29;
                auVar70._4_4_ = auVar77._4_4_ + pfVar48[1] * pfVar29[1];
                auVar70._8_4_ = auVar77._8_4_ + pfVar48[2] * pfVar29[2];
                auVar70._12_4_ = auVar77._12_4_ + pfVar48[3] * pfVar29[3];
                pfVar48 = pfVar48 + 4;
                pfVar29 = pfVar29 + iVar35;
                auVar77 = auVar70;
              }
              pfVar52 = pfVar52 + uVar58 * 4;
            }
            else {
              pfVar29 = (float *)((long)local_b8.data +
                                 lVar51 + (long)(iVar7 * iVar6 * (int)uVar28) * 4);
            }
            uVar54 = uVar58;
            pfVar48 = pfVar52;
            if (iVar6 == 1) {
              while ((int)uVar54 != 0) {
                auVar71._0_4_ = auVar77._0_4_ + *pfVar29 * *pfVar48;
                auVar71._4_4_ = auVar77._4_4_ + pfVar29[lVar61] * pfVar48[1];
                auVar71._8_4_ = auVar77._8_4_ + pfVar29[iVar22] * pfVar48[2];
                auVar71._12_4_ = auVar77._12_4_ + pfVar29[iVar46] * pfVar48[3];
                pfVar29 = pfVar29 + lVar59;
                uVar54 = (ulong)((int)uVar54 - 1);
                pfVar48 = pfVar48 + 4;
                auVar77 = auVar71;
              }
              pfVar52 = pfVar52 + uVar58 * 4;
            }
            uVar42 = uVar42 + 4;
            lVar50 = lVar50 + lVar43 * 4;
            pfVar27 = pfVar27 + lVar43;
          }
          auVar73._4_4_ = auVar77._12_4_ + auVar77._4_4_;
          auVar73._0_4_ = auVar73._4_4_;
          auVar73._8_4_ = auVar73._4_4_;
          auVar73._12_4_ = auVar73._4_4_;
          auVar74._4_12_ = auVar73._4_12_;
          auVar74._0_4_ = auVar73._4_4_ + fVar96 + auVar77._8_4_ + auVar77._0_4_;
          for (; (long)(uVar42 | 1) < lVar55; uVar42 = uVar42 + 2) {
            lVar51 = 0;
            for (lVar56 = 0; uVar8 != (uint)lVar56; lVar56 = lVar56 + 1) {
              auVar74._0_4_ =
                   auVar74._0_4_ +
                   *(float *)((long)pfVar27 + lVar51) * (float)*(undefined8 *)(pfVar52 + lVar56 * 2)
                   + *(float *)(lVar50 + lVar51) *
                     (float)((ulong)*(undefined8 *)(pfVar52 + lVar56 * 2) >> 0x20);
              lVar51 = lVar51 + lVar60;
            }
            pfVar52 = pfVar52 + uVar58 * 2;
            lVar50 = lVar50 + lVar43 * 2;
            pfVar27 = (float *)((long)pfVar27 + lVar43 * 2);
          }
          for (; fVar96 = auVar74._0_4_, (long)uVar42 < lVar55; uVar42 = uVar42 + 1) {
            pfVar29 = pfVar27;
            for (lVar50 = 0; uVar8 != (uint)lVar50; lVar50 = lVar50 + 1) {
              auVar74._0_4_ = auVar74._0_4_ + pfVar52[lVar50] * *pfVar29;
              pfVar29 = pfVar29 + lVar59;
            }
            pfVar52 = pfVar52 + uVar58;
            pfVar27 = (float *)((long)pfVar27 + lVar43);
          }
          auVar64 = auVar74;
          switch(iVar57) {
          case 1:
            if (fVar96 <= 0.0) {
              auVar21._12_4_ = 0;
              auVar21._0_12_ = auVar74._4_12_;
              auVar64 = auVar21 << 0x20;
            }
            break;
          case 2:
            auVar64 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar96) & (uint)*pfVar33 |
                                            -(uint)(0.0 < fVar96) & 0x3f800000) * fVar96));
            break;
          case 3:
            if (fVar96 <= *pfVar33) {
              auVar74._0_4_ = *pfVar33;
            }
            fVar96 = pfVar33[1];
            auVar64 = auVar74;
            if (fVar96 < auVar74._0_4_) {
LAB_004c8505:
              auVar64 = ZEXT416((uint)fVar96);
            }
            break;
          case 4:
            if (88.37626 <= fVar96) {
              fVar96 = 88.37626;
            }
            fVar96 = expf((float)(-(uint)(fVar96 < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(fVar96 < -88.37626) & (uint)-fVar96));
            auVar64 = ZEXT416((uint)(1.0 / (fVar96 + 1.0)));
            break;
          case 5:
            fVar97 = expf(fVar96);
            fVar97 = logf(fVar97 + 1.0);
            fVar97 = tanhf(fVar97);
            auVar64._0_4_ = fVar97 * fVar96;
            auVar64._4_12_ = extraout_var;
            break;
          case 6:
            fVar97 = *pfVar33;
            fVar98 = -pfVar33[1] / fVar97;
            auVar64 = ZEXT816(0);
            if ((fVar98 <= fVar96) && (auVar64 = auVar74, fVar96 <= fVar98 + 1.0 / fVar97)) {
              fVar96 = (fVar97 * fVar96 + pfVar33[1]) * fVar96;
              goto LAB_004c8505;
            }
          }
          *puVar53 = auVar64._0_4_;
          puVar53 = puVar53 + 1;
          iVar41 = iVar41 + iVar7 * iVar6;
          lVar31 = lVar31 + lVar1;
          lVar38 = lVar38 + lVar1;
        }
      }
      iVar57 = 0;
    }
  }
  piVar23 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (piVar23 != (int *)0x0) {
    LOCK();
    *piVar23 = *piVar23 + -1;
    UNLOCK();
    if (*piVar23 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        free(local_b8.data);
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar57;
}

Assistant:

int Convolution1D_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}